

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::cpp_function::cpp_function<void,Person,std::shared_ptr<Job>const&>
          (cpp_function *this,offset_in_Job_to_subr f)

{
  function_record *rec;
  void *in_RDX;
  descr<20UL,_2UL> signature;
  char local_48 [24];
  type_info *ptStack_30;
  pointer_____offset_0x10___ *local_28;
  undefined8 uStack_20;
  
  (this->super_function).super_object.super_handle.m_ptr = (PyObject *)0x0;
  rec = make_function_record(this);
  rec->data[0] = (void *)f;
  rec->data[1] = in_RDX;
  rec->impl = initialize<pybind11::cpp_function::initialize<void,Person,std::shared_ptr<Job>const&>(void(Person::*)(std::shared_ptr<Job>const&))::{lambda(pybind11::detail::function_record*,pybind11::handle,pybind11::handle,pybind11::handle)#1}(Person*,std::shared_ptr<Job>const&)#1},void,Person*,std::shared_ptr<Job>const&>(pybind11::cpp_function::initialize<void,Person,std::shared_ptr<Job>const&>(void(Person::*)(std::shared_ptr<Job>const&))::{lambda(pybind11::detail::function_record*,pybind11::handle,pybind11::handle,pybind11::handle)#1}(Person*,std::shared_ptr<Job>const&)#1}&&,void(*)(Person*,std::shared_ptr<Job>const&))
              ::
              {lambda(pybind11::detail::function_record*,pybind11::handle,pybind11::handle,pybind11::handle)#1}
              ::handle_;
  local_28 = &Job::typeinfo;
  uStack_20 = 0;
  builtin_strncpy(local_48 + 0x10,"one}",5);
  local_48[0x15] = '\0';
  local_48[0x16] = '\0';
  local_48[0x17] = '\0';
  ptStack_30 = (type_info *)&Person::typeinfo;
  builtin_strncpy(local_48,"({%}, {%}) -> {N",0x10);
  initialize_generic(this,rec,local_48,&ptStack_30,2);
  return;
}

Assistant:

cpp_function(Return (Class::*f)(Arg...) PYBIND11_NOEXCEPT_SPECIFIER, const Extra&... extra) {
        initialize([f](Class *c, Arg... args) -> Return { return (c->*f)(args...); },
                   (Return (*) (Class *, Arg...) PYBIND11_NOEXCEPT_SPECIFIER) nullptr, extra...);
    }